

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcDecrypt.c
# Opt level: O1

void cbc512Decrypt(ThreefishKey_t *key,uint64_t *iv,uint64_t *cipher_text,uint64_t num_blocks)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t *in;
  ulong uVar11;
  bool bVar12;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  
  if (num_blocks << 3 != 0) {
    uVar3 = 0;
    uVar4 = 0;
    uVar11 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    local_50 = 0;
    local_58 = 0;
    uVar10 = 0;
    local_60 = 0;
    local_68 = 0;
    local_70 = 0;
    local_78 = 0;
    local_80 = 0;
    local_88 = 0;
    in = cipher_text;
    do {
      bVar12 = (uVar4 & 8) == 0;
      uVar2 = cipher_text[uVar4 + 1];
      if (bVar12) {
        local_50 = cipher_text[uVar4 + 1];
        uVar2 = local_88;
      }
      local_88 = uVar2;
      uVar2 = cipher_text[uVar4 + 2];
      if (bVar12) {
        uVar9 = cipher_text[uVar4 + 2];
        uVar2 = local_80;
      }
      local_80 = uVar2;
      uVar2 = cipher_text[uVar4 + 3];
      if (bVar12) {
        uVar8 = cipher_text[uVar4 + 3];
        uVar2 = local_78;
      }
      local_78 = uVar2;
      uVar2 = cipher_text[uVar4 + 4];
      if (bVar12) {
        uVar7 = cipher_text[uVar4 + 4];
        uVar2 = local_70;
      }
      local_70 = uVar2;
      uVar2 = cipher_text[uVar4 + 5];
      if (bVar12) {
        uVar6 = cipher_text[uVar4 + 5];
        uVar2 = local_68;
      }
      local_68 = uVar2;
      uVar2 = cipher_text[uVar4 + 6];
      if (bVar12) {
        uVar5 = cipher_text[uVar4 + 6];
        uVar2 = local_60;
      }
      local_60 = uVar2;
      uVar2 = cipher_text[uVar4 + 7];
      if (bVar12) {
        uVar11 = cipher_text[uVar4 + 7];
        uVar2 = uVar10;
      }
      uVar10 = uVar2;
      uVar2 = cipher_text[uVar4];
      if (!bVar12) {
        uVar3 = cipher_text[uVar4];
        uVar2 = local_58;
      }
      local_58 = uVar2;
      threefishDecryptBlockWords(key,in,in);
      if (uVar4 == 0) {
        *cipher_text = *cipher_text ^ *iv;
        cipher_text[1] = cipher_text[1] ^ iv[1];
        cipher_text[2] = cipher_text[2] ^ iv[2];
        cipher_text[3] = cipher_text[3] ^ iv[3];
        cipher_text[4] = cipher_text[4] ^ iv[4];
        cipher_text[5] = cipher_text[5] ^ iv[5];
        cipher_text[6] = cipher_text[6] ^ iv[6];
        uVar2 = iv[7];
        puVar1 = cipher_text + 7;
      }
      else {
        puVar1 = in + 7;
        if ((uVar4 & 8) == 0) {
          cipher_text[uVar4] = cipher_text[uVar4] ^ uVar3;
          cipher_text[uVar4 + 1] = cipher_text[uVar4 + 1] ^ local_88;
          cipher_text[uVar4 + 2] = cipher_text[uVar4 + 2] ^ local_80;
          cipher_text[uVar4 + 3] = cipher_text[uVar4 + 3] ^ local_78;
          cipher_text[uVar4 + 4] = cipher_text[uVar4 + 4] ^ local_70;
          cipher_text[uVar4 + 5] = cipher_text[uVar4 + 5] ^ local_68;
          cipher_text[uVar4 + 6] = cipher_text[uVar4 + 6] ^ local_60;
          uVar2 = uVar10;
        }
        else {
          cipher_text[uVar4] = cipher_text[uVar4] ^ local_58;
          cipher_text[uVar4 + 1] = cipher_text[uVar4 + 1] ^ local_50;
          cipher_text[uVar4 + 2] = cipher_text[uVar4 + 2] ^ uVar9;
          cipher_text[uVar4 + 3] = cipher_text[uVar4 + 3] ^ uVar8;
          cipher_text[uVar4 + 4] = cipher_text[uVar4 + 4] ^ uVar7;
          cipher_text[uVar4 + 5] = cipher_text[uVar4 + 5] ^ uVar6;
          cipher_text[uVar4 + 6] = cipher_text[uVar4 + 6] ^ uVar5;
          uVar2 = uVar11;
        }
      }
      *puVar1 = *puVar1 ^ uVar2;
      uVar4 = uVar4 + 8;
      in = in + 8;
    } while (uVar4 < num_blocks << 3);
  }
  return;
}

Assistant:

void cbc512Decrypt(ThreefishKey_t* key,
                   const uint64_t* iv,
                   uint64_t* cipher_text,
                   const uint64_t num_blocks)
{
    pd3("cbc512Decrypt()\n");
    uint64_t prev_block_odd[SECURE_SLICE] = {0, 0, 0 ,0 ,0 ,0 ,0 ,0}; //allocate 1 block of storage to store the previous cipher text 
    uint64_t prev_block_even[SECURE_SLICE] = {0, 0, 0 ,0 ,0 ,0 ,0 ,0}; //allocate 1 block of storage to store the previous cipher text
    
    pd3("decrypting %lu blocks\n", num_blocks);
    //pBuff(32, (uint8_t*)iv);

    for(uint64_t block=0; block<(num_blocks*SECURE_SLICE); block+=SECURE_SLICE) //run each block through the cipher (in decrypt mode)
    {
        bool even = ((block/SECURE_SLICE)%2 == 0) ? true : false;

        if(even)
        {
            //save the previous cipher text block if it is even 
            prev_block_even[0] = cipher_text[block];
            prev_block_even[1] = cipher_text[block+1];
            prev_block_even[2] = cipher_text[block+2];
            prev_block_even[3] = cipher_text[block+3];
            prev_block_even[4] = cipher_text[block+4];
            prev_block_even[5] = cipher_text[block+5];
            prev_block_even[6] = cipher_text[block+6];
            prev_block_even[7] = cipher_text[block+7];
        }
	else
        {
            //save the previous cipher text block if it is odd
            prev_block_odd[0] = cipher_text[block];
            prev_block_odd[1] = cipher_text[block+1];
            prev_block_odd[2] = cipher_text[block+2];
            prev_block_odd[3] = cipher_text[block+3];
            prev_block_odd[4] = cipher_text[block+4];
            prev_block_odd[5] = cipher_text[block+5];
            prev_block_odd[6] = cipher_text[block+6];
            prev_block_odd[7] = cipher_text[block+7];
        }

        //Run the block through the cipher
        threefishDecryptBlockWords(key, &cipher_text[block], &cipher_text[block]);
        if(block == 0) //xor the first block with the initialization vector
        {
            cipher_text[0] ^= iv[0]; cipher_text[1] ^= iv[1];
            cipher_text[2] ^= iv[2]; cipher_text[3] ^= iv[3];
            cipher_text[4] ^= iv[4]; cipher_text[5] ^= iv[5];
            cipher_text[6] ^= iv[6]; cipher_text[7] ^= iv[7];
        }
        else //xor the current block with the previous block of cipher text
        {
            if(even)
            {
                cipher_text[block] ^= prev_block_odd[0];
                cipher_text[block+1] ^= prev_block_odd[1];
                cipher_text[block+2] ^= prev_block_odd[2];
                cipher_text[block+3] ^= prev_block_odd[3];
                cipher_text[block+4] ^= prev_block_odd[4];
                cipher_text[block+5] ^= prev_block_odd[5];
                cipher_text[block+6] ^= prev_block_odd[6];
                cipher_text[block+7] ^= prev_block_odd[7];
            }
            else
            {
                cipher_text[block] ^= prev_block_even[0];
                cipher_text[block+1] ^= prev_block_even[1];
                cipher_text[block+2] ^= prev_block_even[2];
                cipher_text[block+3] ^= prev_block_even[3];
                cipher_text[block+4] ^= prev_block_even[4];
                cipher_text[block+5] ^= prev_block_even[5];
                cipher_text[block+6] ^= prev_block_even[6];
                cipher_text[block+7] ^= prev_block_even[7];
            }
        }
    }
}